

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> * __thiscall
helics::FederateState::getPublishedValue
          (pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_>
           *__return_storage_ptr__,FederateState *this,InterfaceHandle handle)

{
  PublicationInfo *pPVar1;
  SmallBuffer local_78;
  
  pPVar1 = InterfaceInfo::getPublication(&this->interfaceInformation,handle);
  if (pPVar1 == (PublicationInfo *)0x0) {
    local_78.buffer._M_elems[0x30] = 0;
    local_78.buffer._M_elems[0x31] = 0;
    local_78.buffer._M_elems[0x32] = 0;
    local_78.buffer._M_elems[0x33] = 0;
    local_78.buffer._M_elems[0x34] = 0;
    local_78.buffer._M_elems[0x35] = 0;
    local_78.buffer._M_elems[0x36] = 0;
    local_78.buffer._M_elems[0x37] = 0;
    local_78.buffer._M_elems[0x38] = 0;
    local_78.buffer._M_elems[0x39] = 0;
    local_78.buffer._M_elems[0x3a] = 0;
    local_78.buffer._M_elems[0x3b] = 0;
    local_78.buffer._M_elems[0x3c] = 0;
    local_78.buffer._M_elems[0x3d] = 0;
    local_78.buffer._M_elems[0x3e] = 0;
    local_78.buffer._M_elems[0x3f] = 0;
    local_78.buffer._M_elems[0x20] = 0;
    local_78.buffer._M_elems[0x21] = 0;
    local_78.buffer._M_elems[0x22] = 0;
    local_78.buffer._M_elems[0x23] = 0;
    local_78.buffer._M_elems[0x24] = 0;
    local_78.buffer._M_elems[0x25] = 0;
    local_78.buffer._M_elems[0x26] = 0;
    local_78.buffer._M_elems[0x27] = 0;
    local_78.buffer._M_elems[0x28] = 0;
    local_78.buffer._M_elems[0x29] = 0;
    local_78.buffer._M_elems[0x2a] = 0;
    local_78.buffer._M_elems[0x2b] = 0;
    local_78.buffer._M_elems[0x2c] = 0;
    local_78.buffer._M_elems[0x2d] = 0;
    local_78.buffer._M_elems[0x2e] = 0;
    local_78.buffer._M_elems[0x2f] = 0;
    local_78.buffer._M_elems[0x10] = 0;
    local_78.buffer._M_elems[0x11] = 0;
    local_78.buffer._M_elems[0x12] = 0;
    local_78.buffer._M_elems[0x13] = 0;
    local_78.buffer._M_elems[0x14] = 0;
    local_78.buffer._M_elems[0x15] = 0;
    local_78.buffer._M_elems[0x16] = 0;
    local_78.buffer._M_elems[0x17] = 0;
    local_78.buffer._M_elems[0x18] = 0;
    local_78.buffer._M_elems[0x19] = 0;
    local_78.buffer._M_elems[0x1a] = 0;
    local_78.buffer._M_elems[0x1b] = 0;
    local_78.buffer._M_elems[0x1c] = 0;
    local_78.buffer._M_elems[0x1d] = 0;
    local_78.buffer._M_elems[0x1e] = 0;
    local_78.buffer._M_elems[0x1f] = 0;
    local_78.buffer._M_elems[0] = 0;
    local_78.buffer._M_elems[1] = 0;
    local_78.buffer._M_elems[2] = 0;
    local_78.buffer._M_elems[3] = 0;
    local_78.buffer._M_elems[4] = 0;
    local_78.buffer._M_elems[5] = 0;
    local_78.buffer._M_elems[6] = 0;
    local_78.buffer._M_elems[7] = 0;
    local_78.buffer._M_elems[8] = 0;
    local_78.buffer._M_elems[9] = 0;
    local_78.buffer._M_elems[10] = 0;
    local_78.buffer._M_elems[0xb] = 0;
    local_78.buffer._M_elems[0xc] = 0;
    local_78.buffer._M_elems[0xd] = 0;
    local_78.buffer._M_elems[0xe] = 0;
    local_78.buffer._M_elems[0xf] = 0;
    local_78.bufferSize = 0;
    local_78.bufferCapacity = 0x40;
    local_78.nonOwning = false;
    local_78.locked = false;
    local_78.usingAllocatedBuffer = false;
    local_78.errorCondition = '\0';
    local_78.userKey = 0;
    local_78.heap = (byte *)&local_78;
    SmallBuffer::SmallBuffer(&__return_storage_ptr__->first,&local_78);
    (__return_storage_ptr__->second).internalTimeCode = -0x7fffffffffffffff;
    SmallBuffer::~SmallBuffer(&local_78);
  }
  else {
    std::pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_>::
    pair<helics::SmallBuffer_&,_TimeRepresentation<count_time<9,_long>_>_&,_true>
              (__return_storage_ptr__,&pPVar1->data,&pPVar1->lastPublishTime);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<SmallBuffer, Time> FederateState::getPublishedValue(InterfaceHandle handle)
{
    auto* pub = interfaces().getPublication(handle);
    if (pub != nullptr) {
        return {pub->data, pub->lastPublishTime};
    }
    return {SmallBuffer{}, Time::minVal()};
}